

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message-test.c++
# Opt level: O1

void __thiscall capnp::_::anon_unknown_0::TestCase93::run(TestCase93 *this)

{
  size_t sVar1;
  Builder builder_00;
  ArrayPtr<const_capnp::word> *pAVar2;
  SegmentInit *pSVar3;
  ArrayPtr<const_capnp::word> *pAVar4;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar5;
  ArrayPtr<capnp::MessageBuilder::SegmentInit> segments;
  Reader value;
  Array<capnp::MessageBuilder::SegmentInit> segInits;
  TestInitMessageBuilder builder2;
  MallocMessageBuilder builder;
  Builder local_2d8;
  int local_2bc;
  PointerBuilder local_2b8;
  StructBuilder local_298;
  SegmentInit *local_268;
  size_t sStack_260;
  undefined8 *local_258;
  WirePointer local_250;
  StructBuilder local_248;
  void *in_stack_fffffffffffffdf0;
  WirePointer *in_stack_fffffffffffffdf8;
  undefined8 in_stack_fffffffffffffe00;
  MallocMessageBuilder local_110;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_110,1,FIXED_SIZE);
  MessageBuilder::getRootInternal((Builder *)&local_298,&local_110.super_MessageBuilder);
  PointerBuilder::getStruct
            ((StructBuilder *)&stack0xfffffffffffffde0,(PointerBuilder *)&stack0xfffffffffffffe08,
             (StructSize)0x140006,(word *)0x0);
  builder_00._builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffdf8;
  builder_00._builder.segment = (SegmentBuilder *)in_stack_fffffffffffffdf0;
  builder_00._builder.data = (void *)in_stack_fffffffffffffe00;
  builder_00._builder.pointers = (WirePointer *)local_298.segment;
  builder_00._builder._32_8_ = local_298.capTable;
  initTestMessage(builder_00);
  AVar5 = MessageBuilder::getSegmentsForOutput(&local_110.super_MessageBuilder);
  local_298.segment = (SegmentBuilder *)AVar5.size_;
  pAVar2 = AVar5.ptr;
  if (local_298.segment == (SegmentBuilder *)0x1) {
    local_2b8.segment = (SegmentBuilder *)CONCAT44(local_2b8.segment._4_4_,1);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,int,unsigned_long>
              ((Fault *)&stack0xfffffffffffffe08,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/message-test.c++"
               ,0x67,FAILED,"(1) != (segs.size())","1, segs.size()",(int *)&local_2b8,
               (unsigned_long *)&local_298);
    kj::_::Debug::Fault::fatal((Fault *)&stack0xfffffffffffffe08);
  }
  local_268 = (SegmentInit *)
              kj::_::HeapArrayDisposer::allocateImpl
                        (0x18,0,(size_t)local_298.segment,(_func_void_void_ptr *)0x0,
                         (_func_void_void_ptr *)0x0);
  pSVar3 = local_268;
  if (local_298.segment != (SegmentBuilder *)0x0) {
    pAVar4 = pAVar2 + (long)local_298.segment;
    do {
      sVar1 = pAVar2->size_;
      (pSVar3->space).ptr = pAVar2->ptr;
      (pSVar3->space).size_ = sVar1;
      pSVar3->wordsUsed = sVar1;
      pSVar3 = pSVar3 + 1;
      pAVar2 = pAVar2 + 1;
    } while (pAVar2 != pAVar4);
  }
  segments.size_ = ((long)pSVar3 - (long)local_268 >> 3) * -0x5555555555555555;
  local_258 = &kj::_::HeapArrayDisposer::instance;
  segments.ptr = local_268;
  sStack_260 = segments.size_;
  MessageBuilder::MessageBuilder((MessageBuilder *)&stack0xfffffffffffffe08,segments);
  MessageBuilder::getRootInternal((Builder *)&local_2b8,(MessageBuilder *)&stack0xfffffffffffffe08);
  local_298.data = local_2b8.pointer;
  local_298.segment = local_2b8.segment;
  local_298.capTable = local_2b8.capTable;
  PointerBuilder::getStruct
            (&local_248,(PointerBuilder *)&local_298,(StructSize)0x140006,(word *)0x0);
  checkTestMessage((Builder)builder.super_MessageBuilder.arenaSpace._0_40_);
  MessageBuilder::getRootInternal(&local_2d8,(MessageBuilder *)&stack0xfffffffffffffe08);
  local_2b8.pointer = local_2d8.builder.pointer;
  local_2b8.segment = local_2d8.builder.segment;
  local_2b8.capTable = local_2d8.builder.capTable;
  PointerBuilder::getStruct(&local_298,&local_2b8,(StructSize)0x140006,(word *)0x0);
  ((WirePointer *)((long)local_298.data + 8))->offsetAndKind = 0x1e1b9;
  ((WirePointer *)((long)local_298.data + 8))->field_1 =
       (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
  MessageBuilder::getRootInternal(&local_2d8,&local_110.super_MessageBuilder);
  local_2b8.pointer = local_2d8.builder.pointer;
  local_2b8.segment = local_2d8.builder.segment;
  local_2b8.capTable = local_2d8.builder.capTable;
  PointerBuilder::getStruct(&local_298,&local_2b8,(StructSize)0x140006,(word *)0x0);
  if ((*(WirePointer *)((long)local_298.data + 8) != (WirePointer)0x1e1b9) &&
     (kj::_::Debug::minSeverity < 3)) {
    local_2bc = 0x1e1b9;
    MessageBuilder::getRootInternal(&local_2d8,&local_110.super_MessageBuilder);
    local_2b8.pointer = local_2d8.builder.pointer;
    local_2b8.segment = local_2d8.builder.segment;
    local_2b8.capTable = local_2d8.builder.capTable;
    PointerBuilder::getStruct(&local_298,&local_2b8,(StructSize)0x140006,(word *)0x0);
    local_250 = *(WirePointer *)((long)local_298.data + 8);
    kj::_::Debug::log<char_const(&)[79],int,long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/message-test.c++"
               ,0x73,ERROR,
               "\"failed: expected \" \"(123321) == (builder.getRoot<TestAllTypes>().getInt64Field())\", 123321, builder.getRoot<TestAllTypes>().getInt64Field()"
               ,(char (*) [79])
                "failed: expected (123321) == (builder.getRoot<TestAllTypes>().getInt64Field())",
               &local_2bc,(long *)&local_250);
  }
  MessageBuilder::getRootInternal(&local_2d8,(MessageBuilder *)&stack0xfffffffffffffe08);
  local_2b8.pointer = local_2d8.builder.pointer;
  local_2b8.segment = local_2d8.builder.segment;
  local_2b8.capTable = local_2d8.builder.capTable;
  PointerBuilder::getStruct(&local_298,&local_2b8,(StructSize)0x140006,(word *)0x0);
  local_2b8.segment = local_298.segment;
  local_2b8.capTable = local_298.capTable;
  local_2b8.pointer = local_298.pointers;
  value.super_StringPtr.content.size_ = 10;
  value.super_StringPtr.content.ptr = "foobarbaz";
  PointerBuilder::setBlob<capnp::Text>(&local_2b8,value);
  if (kj::_::Debug::minSeverity < 3) {
    local_298.segment = (SegmentBuilder *)0x0;
    local_2b8.segment = (SegmentBuilder *)CONCAT44(local_2b8.segment._4_4_,1);
    kj::_::Debug::log<char_const(&)[54],int,unsigned_long>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/message-test.c++"
               ,0x78,ERROR,
               "\"failed: expected \" \"(1) == (builder2.allocations.size())\", 1, builder2.allocations.size()"
               ,(char (*) [54])"failed: expected (1) == (builder2.allocations.size())",
               (int *)&local_2b8,(unsigned_long *)&local_298);
  }
  FlatMessageBuilder::~FlatMessageBuilder((FlatMessageBuilder *)&stack0xfffffffffffffe08);
  sVar1 = sStack_260;
  pSVar3 = local_268;
  if (local_268 != (SegmentInit *)0x0) {
    local_268 = (SegmentInit *)0x0;
    sStack_260 = 0;
    (**(code **)*local_258)(local_258,pSVar3,0x18,sVar1,sVar1,0);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&local_110);
  return;
}

Assistant:

TEST(Message, MessageBuilderInitMultiSegment) {
  // Same as previous test, but with a message containing many segments.

  MallocMessageBuilder builder(1, AllocationStrategy::FIXED_SIZE);
  initTestMessage(builder.getRoot<TestAllTypes>());

  // Pull the segments out and make a segment init table out of them.
  //
  // We const_cast for simplicity of implementing the test, but you shouldn't do that at home. :)
  auto segs = builder.getSegmentsForOutput();
  ASSERT_NE(1, segs.size());

  auto segInits = KJ_MAP(seg, segs) -> MessageBuilder::SegmentInit {
    return { kj::arrayPtr(const_cast<word*>(seg.begin()), seg.size()), seg.size() };
  };

  // Init a new builder from the old segments.
  TestInitMessageBuilder builder2(segInits);
  checkTestMessage(builder2.getRoot<TestAllTypes>());

  // Verify that they're really using the same underlying memory.
  builder2.getRoot<TestAllTypes>().setInt64Field(123321);
  EXPECT_EQ(123321, builder.getRoot<TestAllTypes>().getInt64Field());

  // Force builder2 to allocate new space.
  EXPECT_EQ(0, builder2.allocations.size());
  builder2.getRoot<TestAllTypes>().setTextField("foobarbaz");
  EXPECT_EQ(1, builder2.allocations.size());
}